

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlifMv.c
# Opt level: O0

void Io_WriteBlifMv(Abc_Ntk_t *pNtk,char *FileName)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Ntk_t *pNtk_00;
  int local_2c;
  int i;
  Abc_Ntk_t *pNtkTemp;
  FILE *pFile;
  char *FileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsNetlist(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlifMv.c"
                  ,0x3f,"void Io_WriteBlifMv(Abc_Ntk_t *, char *)");
  }
  iVar2 = Abc_NtkHasBlifMv(pNtk);
  if (iVar2 != 0) {
    __stream = fopen(FileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Io_WriteBlifMv(): Cannot open the output file.\n");
    }
    else {
      pcVar1 = pNtk->pName;
      pcVar3 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
      Io_NtkWriteBlifMv((FILE *)__stream,pNtk);
      if (pNtk->pDesign != (Abc_Des_t *)0x0) {
        for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->pDesign->vModules), local_2c < iVar2;
            local_2c = local_2c + 1) {
          pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vModules,local_2c);
          if (pNtk_00 != pNtk) {
            fprintf(__stream,"\n\n");
            Io_NtkWriteBlifMv((FILE *)__stream,pNtk_00);
          }
        }
      }
      fclose(__stream);
    }
    return;
  }
  __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlifMv.c"
                ,0x40,"void Io_WriteBlifMv(Abc_Ntk_t *, char *)");
}

Assistant:

void Io_WriteBlifMv( Abc_Ntk_t * pNtk, char * FileName )
{
    FILE * pFile;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlifMv(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the master network
    Io_NtkWriteBlifMv( pFile, pNtk );
    // write the remaining networks
    if ( pNtk->pDesign )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            fprintf( pFile, "\n\n" );
            Io_NtkWriteBlifMv( pFile, pNtkTemp );
        }
    }
    fclose( pFile );
}